

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteFieldDocComment
               (Printer *printer,FieldDescriptor *field,Options *options,bool kdoc)

{
  pointer pcVar1;
  string_view text;
  string_view text_00;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  local_80[4] = options->opensource_runtime;
  local_80[5] = options->annotate_code;
  local_80[0] = options->generate_immutable_code;
  local_80[1] = options->generate_mutable_code;
  local_80[2] = options->generate_shared_code;
  local_80[3] = options->enforce_lite;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (options->annotation_list_file)._M_string_length);
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (options->output_list_file)._M_string_length);
  local_38._0_1_ = options->strip_nonfunctional_codegen;
  local_38._1_1_ = options->jvm_dsl;
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field,(Options *)local_80,kdoc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  local_d0[4] = options->opensource_runtime;
  local_d0[5] = options->annotate_code;
  local_d0[0] = options->generate_immutable_code;
  local_d0[1] = options->generate_mutable_code;
  local_d0[2] = options->generate_shared_code;
  local_d0[3] = options->enforce_lite;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + (options->annotation_list_file)._M_string_length);
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + (options->output_list_file)._M_string_length);
  local_88._0_1_ = options->strip_nonfunctional_codegen;
  local_88._1_1_ = options->jvm_dsl;
  WriteDebugString(printer,field,(Options *)local_d0,kdoc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  text_00._M_str = " */\n";
  text_00._M_len = 4;
  io::Printer::Print<>(printer,text_00);
  return;
}

Assistant:

void WriteFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                          const Options options, const bool kdoc) {
  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then continue with the field declaration,
  // e.g.:
  //   optional string foo = 5;
  // And then we end with the javadoc tags if applicable.
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field, options, kdoc);
  WriteDebugString(printer, field, options, kdoc);
  printer->Print(" */\n");
}